

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

QByteArray * __thiscall
QTlsPrivate::TlsKey::pemFooter(QByteArray *__return_storage_ptr__,TlsKey *this)

{
  int iVar1;
  char *pcVar2;
  qsizetype qVar3;
  
  iVar1 = (*this->_vptr_TlsKey[10])(this);
  if (iVar1 == 1) {
    qVar3 = 0x18;
    pcVar2 = "-----END PUBLIC KEY-----";
  }
  else {
    iVar1 = (*this->_vptr_TlsKey[0xb])(this);
    qVar3 = 0x1d;
    if (iVar1 == 1) {
      pcVar2 = "-----END RSA PRIVATE KEY-----";
    }
    else {
      iVar1 = (*this->_vptr_TlsKey[0xb])(this);
      if (iVar1 == 2) {
        pcVar2 = "-----END DSA PRIVATE KEY-----";
      }
      else {
        iVar1 = (*this->_vptr_TlsKey[0xb])(this);
        if (iVar1 == 3) {
          qVar3 = 0x1c;
          pcVar2 = "-----END EC PRIVATE KEY-----";
        }
        else {
          (*this->_vptr_TlsKey[0xb])(this);
          qVar3 = 0x19;
          pcVar2 = "-----END PRIVATE KEY-----";
        }
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = pcVar2;
  (__return_storage_ptr__->d).size = qVar3;
  return __return_storage_ptr__;
}

Assistant:

QByteArray TlsKey::pemFooter() const
{
    if (type() == QSsl::PublicKey)
        return QByteArrayLiteral("-----END PUBLIC KEY-----");
    else if (algorithm() == QSsl::Rsa)
        return QByteArrayLiteral("-----END RSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dsa)
        return QByteArrayLiteral("-----END DSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Ec)
        return QByteArrayLiteral("-----END EC PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dh)
        return QByteArrayLiteral("-----END PRIVATE KEY-----");

    Q_UNREACHABLE_RETURN({});
}